

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

double __thiscall IF97::Region3::lambda1(Region3 *this,double T,double rho)

{
  size_type sVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong local_38;
  size_t i;
  double summer;
  double rho_bar;
  double rho_local;
  double T_local;
  Region3 *this_local;
  
  i = 0;
  local_38 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->lamJr);
    if (sVar1 <= local_38) break;
    dVar4 = Trterm(this,T);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->lamIr,local_38);
    dVar5 = powi(dVar4,*pvVar2);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->lamnr,local_38);
    dVar4 = *pvVar3;
    dVar6 = Rhorterm(this,rho);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->lamJr,local_38);
    dVar6 = powi(dVar6,*pvVar2);
    i = (size_t)((rho / 322.0) * dVar5 * dVar4 * dVar6 + (double)i);
    local_38 = local_38 + 1;
  }
  dVar4 = exp((double)i);
  return dVar4;
}

Assistant:

double lambda1(double T, double rho) const{
            const double rho_bar = rho/Rhocrit;
            double summer = 0.0;
            for (std::size_t i = 0; i < lamJr.size(); ++i){
                summer += rho_bar * powi(Trterm(T),lamIr[i]) * lamnr[i]*powi(Rhorterm(rho),lamJr[i]);
            }
            return exp(summer);
        }